

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  mz_bool mVar1;
  size_t sVar2;
  mz_ulong mVar3;
  mz_uint8 *ptr;
  size_t sVar4;
  undefined8 in_RCX;
  code *in_RDX;
  mz_uint in_ESI;
  mz_zip_archive *in_RDI;
  uint in_R8D;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint8 *pWrite_buf_cur;
  tinfl_decompressor inflator;
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  void *pWrite_buf;
  void *pRead_buf;
  mz_zip_archive_file_stat file_stat;
  mz_uint64 cur_file_ofs;
  mz_uint64 out_buf_ofs;
  mz_uint64 comp_remaining;
  mz_uint64 read_buf_avail;
  mz_uint64 read_buf_ofs;
  mz_uint64 read_buf_size;
  mz_uint file_crc32;
  int status;
  bool local_2e19;
  mz_zip_archive_file_stat *in_stack_ffffffffffffd1e8;
  undefined8 in_stack_ffffffffffffd1f0;
  mz_zip_archive *in_stack_ffffffffffffd1f8;
  size_t *in_stack_ffffffffffffd440;
  mz_uint8 *in_stack_ffffffffffffd448;
  mz_uint8 *in_stack_ffffffffffffd450;
  size_t *in_stack_ffffffffffffd458;
  mz_uint8 *in_stack_ffffffffffffd460;
  tinfl_decompressor *in_stack_ffffffffffffd468;
  mz_uint32 in_stack_ffffffffffffd480;
  int local_2e8 [6];
  ushort local_2ce;
  ushort local_2cc;
  void *local_2c0;
  mz_uint8 *local_2b8;
  ushort local_2a4;
  short local_2a2;
  uint local_298;
  ulong local_290;
  ulong local_288;
  mz_uint64 local_278;
  mz_uint64 local_68;
  ulong local_60;
  ulong local_58;
  size_t local_50;
  long local_48;
  size_t local_40;
  uint local_34;
  tinfl_status local_30;
  uint local_2c;
  undefined8 local_28;
  code *local_20;
  mz_uint local_14;
  mz_zip_archive *local_10;
  uint local_4;
  
  local_30 = TINFL_STATUS_DONE;
  local_34 = 0;
  local_48 = 0;
  local_60 = 0;
  local_2b8 = (mz_uint8 *)0x0;
  local_2c0 = (void *)0x0;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  mVar1 = mz_zip_reader_file_stat
                    (in_stack_ffffffffffffd1f8,(mz_uint)((ulong)in_stack_ffffffffffffd1f0 >> 0x20),
                     in_stack_ffffffffffffd1e8);
  if (mVar1 == 0) {
    local_4 = 0;
  }
  else if (local_290 == 0) {
    local_4 = 1;
  }
  else {
    mVar1 = mz_zip_reader_is_file_a_directory(local_10,local_14);
    if (mVar1 == 0) {
      if ((local_2a4 & 0x21) == 0) {
        if ((((local_2c & 0x400) == 0) && (local_2a2 != 0)) && (local_2a2 != 8)) {
          local_4 = 0;
        }
        else {
          local_68 = local_278;
          sVar2 = (*local_10->m_pRead)(local_10->m_pIO_opaque,local_278,local_2e8,0x1e);
          if (sVar2 == 0x1e) {
            if (local_2e8[0] == 0x4034b50) {
              local_68 = (local_2ce + 0x1e + (uint)local_2cc) + local_68;
              if (local_10->m_archive_size < local_68 + local_290) {
                local_4 = 0;
              }
              else {
                if (local_10->m_pState->m_pMem == (void *)0x0) {
                  local_40 = local_290;
                  if (0xffff < local_290) {
                    local_40 = 0x10000;
                  }
                  local_2b8 = (mz_uint8 *)
                              (*local_10->m_pAlloc)(local_10->m_pAlloc_opaque,1,local_40);
                  if (local_2b8 == (mz_uint8 *)0x0) {
                    return 0;
                  }
                  local_50 = 0;
                  local_58 = local_290;
                }
                else {
                  local_2b8 = (mz_uint8 *)((long)local_10->m_pState->m_pMem + local_68);
                  local_50 = local_290;
                  local_40 = local_290;
                  local_58 = 0;
                }
                if (((local_2c & 0x400) == 0) && (local_2a2 != 0)) {
                  local_2c0 = (*local_10->m_pAlloc)(local_10->m_pAlloc_opaque,1,0x8000);
                  if (local_2c0 == (void *)0x0) {
                    local_30 = TINFL_STATUS_FAILED;
                  }
                  else {
                    do {
                      ptr = (mz_uint8 *)((long)local_2c0 + (local_60 & 0x7fff));
                      sVar2 = 0x8000 - (local_60 & 0x7fff);
                      if ((local_50 == 0) && (local_10->m_pState->m_pMem == (void *)0x0)) {
                        local_50 = local_58;
                        if (local_40 < local_58) {
                          local_50 = local_40;
                        }
                        sVar4 = (*local_10->m_pRead)
                                          (local_10->m_pIO_opaque,local_68,local_2b8,local_50);
                        if (sVar4 != local_50) {
                          local_30 = TINFL_STATUS_FAILED;
                          break;
                        }
                        local_68 = local_50 + local_68;
                        local_58 = local_58 - local_50;
                        local_48 = 0;
                      }
                      sVar4 = local_50;
                      local_30 = tinfl_decompress(in_stack_ffffffffffffd468,
                                                  in_stack_ffffffffffffd460,
                                                  in_stack_ffffffffffffd458,
                                                  in_stack_ffffffffffffd450,
                                                  in_stack_ffffffffffffd448,
                                                  in_stack_ffffffffffffd440,
                                                  in_stack_ffffffffffffd480);
                      local_50 = local_50 - sVar4;
                      local_48 = sVar4 + local_48;
                      if (sVar2 != 0) {
                        sVar4 = (*local_20)(local_28,local_60,ptr,sVar2);
                        if (sVar4 != sVar2) {
                          local_30 = TINFL_STATUS_FAILED;
                          break;
                        }
                        mVar3 = mz_crc32((ulong)local_34,ptr,sVar2);
                        local_34 = (uint)mVar3;
                        local_60 = sVar2 + local_60;
                        if (local_288 < local_60) {
                          local_30 = TINFL_STATUS_FAILED;
                          break;
                        }
                      }
                      local_2e19 = local_30 == TINFL_STATUS_NEEDS_MORE_INPUT ||
                                   local_30 == TINFL_STATUS_HAS_MORE_OUTPUT;
                    } while (local_2e19);
                  }
                }
                else if (local_10->m_pState->m_pMem == (void *)0x0) {
                  for (; local_58 != 0; local_58 = local_58 - local_50) {
                    local_50 = local_58;
                    if (local_40 < local_58) {
                      local_50 = local_40;
                    }
                    sVar2 = (*local_10->m_pRead)(local_10->m_pIO_opaque,local_68,local_2b8,local_50)
                    ;
                    if (sVar2 != local_50) {
                      local_30 = TINFL_STATUS_FAILED;
                      break;
                    }
                    if ((local_2c & 0x400) == 0) {
                      mVar3 = mz_crc32((ulong)local_34,local_2b8,local_50);
                      local_34 = (uint)mVar3;
                    }
                    sVar2 = (*local_20)(local_28,local_60,local_2b8,local_50);
                    if (sVar2 != local_50) {
                      local_30 = TINFL_STATUS_FAILED;
                      break;
                    }
                    local_68 = local_50 + local_68;
                    local_60 = local_50 + local_60;
                  }
                }
                else {
                  sVar2 = (*local_20)(local_28,local_60,local_2b8,local_290);
                  if (sVar2 == local_290) {
                    if ((local_2c & 0x400) == 0) {
                      mVar3 = mz_crc32((ulong)local_34,local_2b8,local_290);
                      local_34 = (uint)mVar3;
                    }
                  }
                  else {
                    local_30 = TINFL_STATUS_FAILED;
                  }
                  local_68 = local_290 + local_68;
                  local_60 = local_290 + local_60;
                  local_58 = 0;
                }
                if (((local_30 == TINFL_STATUS_DONE) && ((local_2c & 0x400) == 0)) &&
                   ((local_60 != local_288 || (local_34 != local_298)))) {
                  local_30 = TINFL_STATUS_FAILED;
                }
                if (local_10->m_pState->m_pMem == (void *)0x0) {
                  (*local_10->m_pFree)(local_10->m_pAlloc_opaque,local_2b8);
                }
                if (local_2c0 != (void *)0x0) {
                  (*local_10->m_pFree)(local_10->m_pAlloc_opaque,local_2c0);
                }
                local_4 = (uint)(local_30 == TINFL_STATUS_DONE);
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip,
                                          mz_uint file_index,
                                          mz_file_write_func pCallback,
                                          void *pOpaque, mz_uint flags) {
  int status = TINFL_STATUS_DONE;
  mz_uint file_crc32 = MZ_CRC32_INIT;
  mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining,
                           out_buf_ofs = 0, cur_file_ofs;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf = NULL;
  void *pWrite_buf = NULL;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  // Decompress the file either directly from memory or from a file input
  // buffer.
  if (pZip->m_pState->m_pMem) {
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else {
    read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint)MZ_ZIP_MAX_IO_BUF_SIZE);
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pState->m_pMem) {
#ifdef _MSC_VER
      if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > 0xFFFFFFFF))
#else
      if (((sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > 0xFFFFFFFF))
#endif
        return MZ_FALSE;
      if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                    (size_t)file_stat.m_comp_size) != file_stat.m_comp_size)
        status = TINFL_STATUS_FAILED;
      else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
        file_crc32 =
            (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf,
                                (size_t)file_stat.m_comp_size);
      cur_file_ofs += file_stat.m_comp_size;
      out_buf_ofs += file_stat.m_comp_size;
      comp_remaining = 0;
    } else {
      while (comp_remaining) {
        read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                          (size_t)read_buf_avail) != read_buf_avail) {
          status = TINFL_STATUS_FAILED;
          break;
        }

        if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
          file_crc32 = (mz_uint32)mz_crc32(
              file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);

        if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                      (size_t)read_buf_avail) != read_buf_avail) {
          status = TINFL_STATUS_FAILED;
          break;
        }
        cur_file_ofs += read_buf_avail;
        out_buf_ofs += read_buf_avail;
        comp_remaining -= read_buf_avail;
      }
    }
  } else {
    tinfl_decompressor inflator;
    tinfl_init(&inflator);

    if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                             TINFL_LZ_DICT_SIZE)))
      status = TINFL_STATUS_FAILED;
    else {
      do {
        mz_uint8 *pWrite_buf_cur =
            (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        size_t in_buf_size,
            out_buf_size =
                TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
          read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
          if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                            (size_t)read_buf_avail) != read_buf_avail) {
            status = TINFL_STATUS_FAILED;
            break;
          }
          cur_file_ofs += read_buf_avail;
          comp_remaining -= read_buf_avail;
          read_buf_ofs = 0;
        }

        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(
            &inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
            (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size,
            comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;

        if (out_buf_size) {
          if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) !=
              out_buf_size) {
            status = TINFL_STATUS_FAILED;
            break;
          }
          file_crc32 =
              (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
          if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
            status = TINFL_STATUS_FAILED;
            break;
          }
        }
      } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) ||
               (status == TINFL_STATUS_HAS_MORE_OUTPUT));
    }
  }

  if ((status == TINFL_STATUS_DONE) &&
      (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (file_crc32 != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if (!pZip->m_pState->m_pMem)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  if (pWrite_buf)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

  return status == TINFL_STATUS_DONE;
}